

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPN::DataSave(OPN *this,OPNData *data)

{
  int local_1c;
  int i;
  OPNData *data_local;
  OPN *this_local;
  
  OPNBase::DataSave(&this->super_OPNBase,&data->opnbase);
  *(undefined8 *)data->fnum = *(undefined8 *)this->fnum;
  data->fnum[2] = this->fnum[2];
  *(undefined8 *)data->fnum3 = *(undefined8 *)this->fnum3;
  data->fnum3[2] = this->fnum3[2];
  *(undefined4 *)data->fnum2 = *(undefined4 *)this->fnum2;
  *(undefined2 *)(data->fnum2 + 4) = *(undefined2 *)(this->fnum2 + 4);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    Channel4::DataSave((Channel4 *)(this->fnum2 + (long)local_1c * 0x2e0 + 8),data->ch + local_1c);
  }
  return;
}

Assistant:

void OPN::DataSave(struct OPNData* data) {
	OPNBase::DataSave(&data->opnbase);
	memcpy(data->fnum, fnum, sizeof(uint) * 3);
	memcpy(data->fnum3, fnum3, sizeof(uint) * 3);
	memcpy(data->fnum2, fnum2, 6);
	for(int i = 0; i < 3; i++) {
		ch[i].DataSave(&data->ch[i]);
	}
}